

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

size_t dgrminer::support<std::set<int,std::less<int>,std::allocator<int>>>
                 (set<int,_std::less<int>,_std::allocator<int>_> *occurrences,
                 unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *multiple_occurrences,bool new_measures,bool heuristic_mis)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  undefined8 uVar8;
  undefined7 in_register_00000011;
  size_t sVar9;
  _Rb_tree_header *p_Var10;
  map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
  mapping;
  set<int,_std::less<int>,_std::allocator<int>_> intersect;
  OverlapGraph og;
  _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
  local_f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  OverlapGraph local_98;
  
  if ((int)CONCAT71(in_register_00000011,new_measures) == 0) {
    sVar9 = (occurrences->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    p_Var7 = (occurrences->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &(occurrences->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var10) {
      p_Var1 = &local_c8._M_impl.super__Rb_tree_header;
      sVar9 = 0;
LAB_001482f4:
      __k = p_Var7 + 1;
      OverlapGraph::OverlapGraph(&local_98,heuristic_mis);
      local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_f8._M_impl.super__Rb_tree_header._M_header;
      local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
      cVar3 = std::
              _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&multiple_occurrences->_M_h,(key_type *)__k);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
LAB_00148534:
        std::__throw_out_of_range("_Map_base::at");
      }
      else {
        for (p_Var5 = *(_Rb_tree_node_base **)
                       ((long)cVar3.
                              super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
                              ._M_cur + 0x28);
            p_Var5 != (_Rb_tree_node_base *)
                      ((long)cVar3.
                             super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
                             ._M_cur + 0x18);
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          iVar2 = OverlapGraph::addVertex(&local_98);
          pmVar4 = std::
                   map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                   ::operator[]((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                                 *)&local_f8,(key_type *)(p_Var5 + 1));
          *pmVar4 = iVar2;
        }
        cVar3 = std::
                _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&multiple_occurrences->_M_h,(key_type *)__k);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          p_Var5 = *(_Rb_tree_node_base **)
                    ((long)cVar3.
                           super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
                           ._M_cur + 0x28);
          do {
            cVar3 = std::
                    _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&multiple_occurrences->_M_h,(key_type *)__k);
            if (cVar3.
                super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
LAB_00148528:
              std::__throw_out_of_range("_Map_base::at");
              goto LAB_00148534;
            }
            if (p_Var5 == (_Rb_tree_node_base *)
                          ((long)cVar3.
                                 super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
                                 ._M_cur + 0x18)) goto LAB_001484aa;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
            while( true ) {
              cVar3 = std::
                      _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&multiple_occurrences->_M_h,(key_type *)__k);
              if (cVar3.
                  super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
                goto LAB_00148528;
              }
              if (p_Var6 == (_Rb_tree_node_base *)
                            ((long)cVar3.
                                   super__Node_iterator_base<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_false>
                                   ._M_cur + 0x18)) break;
              local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_c8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
              local_c8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
              std::
              __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (p_Var5[1]._M_right,&p_Var5[1]._M_parent,p_Var6[1]._M_right,
                         &p_Var6[1]._M_parent,&local_c8,p_Var1);
              if (local_c8._M_impl.super__Rb_tree_header._M_node_count != 0) {
                pmVar4 = std::
                         map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                         ::at((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                               *)&local_f8,(key_type *)(p_Var5 + 1));
                iVar2 = *pmVar4;
                pmVar4 = std::
                         map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                         ::at((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                               *)&local_f8,(key_type *)(p_Var6 + 1));
                OverlapGraph::addEdge(&local_98,iVar2,*pmVar4);
              }
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree(&local_c8);
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            }
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          } while( true );
        }
      }
      uVar8 = std::__throw_out_of_range("_Map_base::at");
      std::
      _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
      ::~_Rb_tree(&local_f8);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_98.adjacencyLists._M_t);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_98.vertices._M_t);
      _Unwind_Resume(uVar8);
    }
    sVar9 = 0;
  }
  return sVar9;
LAB_001484aa:
  iVar2 = OverlapGraph::computeSupport(&local_98);
  sVar9 = sVar9 + (long)iVar2;
  std::
  _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
  ::~_Rb_tree(&local_f8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_98.adjacencyLists._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_98.vertices._M_t);
  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  if ((_Rb_tree_header *)p_Var7 == p_Var10) {
    return sVar9;
  }
  goto LAB_001482f4;
}

Assistant:

inline size_t support(const T &occurrences,
					  const std::unordered_map<int, std::set<std::set<int>>> &multiple_occurrences,
					  bool new_measures,
					  bool heuristic_mis
	) {
	  	if (new_measures) {
		  	size_t support = 0;

			for (auto const &snapshotId : occurrences) {
		  		OverlapGraph og(heuristic_mis);
		  		std::map<std::set<int>, int> mapping;

		  		for (auto const &occurrence : multiple_occurrences.at(snapshotId)) {
					mapping[occurrence] = og.addVertex();
		  		}

			  	for (
			  		auto firstOccurrence = multiple_occurrences.at(snapshotId).begin();
			  		firstOccurrence != multiple_occurrences.at(snapshotId).end();
			  		++firstOccurrence
				) {
					for (
						auto secondOccurrence = std::next(firstOccurrence);
						secondOccurrence != multiple_occurrences.at(snapshotId).end();
						++secondOccurrence
					) {
						std::set<int> intersect;
						std::set_intersection(
							firstOccurrence->begin(), firstOccurrence->end(),
							secondOccurrence->begin(), secondOccurrence->end(),
							std::inserter(intersect,intersect.begin())
						);

						if (!intersect.empty()) {
						  	og.addEdge(mapping.at(*firstOccurrence), mapping.at(*secondOccurrence));
						}
					}
				}

			  	support += og.computeSupport();
			}

		  	return support;
		}

	  	return occurrences.size();
	}